

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O0

void quicly_loss_on_ack_received
               (quicly_loss_t *r,uint64_t largest_newly_acked,size_t epoch,int64_t now,
               int64_t sent_at,uint64_t ack_delay_encoded,int ack_eliciting)

{
  long lVar1;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  quicly_rtt_t *in_R9;
  int in_stack_00000008;
  uint32_t ack_delay_millisecs;
  uint64_t ack_delay_microsecs;
  
  if ((in_RSI != 0xffffffffffffffff) && ('\0' < *(char *)(in_RDI + 0x18))) {
    *(undefined1 *)(in_RDI + 0x18) = 0;
  }
  if (((in_RSI != 0xffffffffffffffff) && (*(ulong *)(in_RDI + 0x28 + in_RDX * 8) <= in_RSI)) &&
     (*(ulong *)(in_RDI + 0x28 + in_RDX * 8) = in_RSI + 1, in_stack_00000008 != 0)) {
    lVar1 = (long)in_R9 << (**(byte **)(in_RDI + 0x10) & 0x3f);
    quicly_rtt_update(in_R9,(uint32_t)((ulong)lVar1 >> 0x20),(uint32_t)lVar1);
  }
  return;
}

Assistant:

inline void quicly_loss_on_ack_received(quicly_loss_t *r, uint64_t largest_newly_acked, size_t epoch, int64_t now, int64_t sent_at,
                                        uint64_t ack_delay_encoded, int ack_eliciting)
{
    /* Reset PTO count if anything is newly acked, and if sender is not speculatively probing at a tail */
    if (largest_newly_acked != UINT64_MAX && r->pto_count > 0)
        r->pto_count = 0;

    /* If largest newly acked is not larger than before, skip RTT sample */
    if (largest_newly_acked == UINT64_MAX || r->largest_acked_packet_plus1[epoch] > largest_newly_acked)
        return;
    r->largest_acked_packet_plus1[epoch] = largest_newly_acked + 1;

    /* If ack does not acknowledge any ack-eliciting packet, skip RTT sample */
    if (!ack_eliciting)
        return;

    /* Decode ack delay */
    uint64_t ack_delay_microsecs = ack_delay_encoded << *r->ack_delay_exponent;
    uint32_t ack_delay_millisecs = (uint32_t)((ack_delay_microsecs * 2 + 1000) / 2000);
    /* use min(ack_delay, max_ack_delay) as the ack delay */
    if (ack_delay_millisecs > *r->max_ack_delay)
        ack_delay_millisecs = *r->max_ack_delay;
    quicly_rtt_update(&r->rtt, (uint32_t)(now - sent_at), ack_delay_millisecs);
}